

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::FileDescriptorProto::ByteSize(FileDescriptorProto *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int32 iVar5;
  int iVar6;
  int iVar7;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  Type *value_03;
  int i;
  int iVar8;
  FileOptions *value_04;
  SourceCodeInfo *value_05;
  int data_size;
  int i_1;
  int iVar9;
  
  uVar4 = this->_has_bits_[0];
  iVar2 = 0;
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      iVar2 = internal::WireFormatLite::StringSize(this->name_);
      iVar2 = iVar2 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 2) != 0) {
      iVar3 = internal::WireFormatLite::StringSize(this->package_);
      iVar2 = iVar2 + iVar3 + 1;
      uVar4 = this->_has_bits_[0];
    }
  }
  if ((uVar4 & 0x1fe00) != 0) {
    if ((uVar4 >> 9 & 1) != 0) {
      value_04 = this->options_;
      if (value_04 == (FileOptions *)0x0) {
        value_04 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileOptions>
                        (value_04);
      iVar2 = iVar2 + iVar3 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 >> 10 & 1) != 0) {
      value_05 = this->source_code_info_;
      if (value_05 == (SourceCodeInfo *)0x0) {
        value_05 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::SourceCodeInfo>
                        (value_05);
      iVar2 = iVar2 + iVar3 + 1;
    }
  }
  iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->dependency_).super_RepeatedPtrFieldBase,iVar8);
    iVar3 = internal::WireFormatLite::StringSize(value);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar3 = 0;
  for (iVar8 = 0; iVar6 = (this->public_dependency_).current_size_, iVar8 < iVar6; iVar8 = iVar8 + 1
      ) {
    iVar5 = public_dependency(this,iVar8);
    iVar6 = io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    iVar3 = iVar3 + iVar6;
  }
  iVar8 = 0;
  for (iVar9 = 0; iVar7 = (this->weak_dependency_).current_size_, iVar9 < iVar7; iVar9 = iVar9 + 1)
  {
    iVar5 = weak_dependency(this,iVar9);
    iVar7 = io::CodedOutputStream::VarintSize32SignExtended(iVar5);
    iVar8 = iVar8 + iVar7;
  }
  iVar9 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar3 + iVar2 + iVar6 + iVar8 + iVar7 + iVar9;
  for (iVar3 = 0; iVar3 < iVar9; iVar3 = iVar3 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(this->message_type_).super_RepeatedPtrFieldBase,iVar3);
    iVar8 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>
                      (value_00);
    iVar2 = iVar2 + iVar8;
    iVar9 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar8);
    iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_01);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(this->service_).super_RepeatedPtrFieldBase,iVar8);
    iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::ServiceDescriptorProto>
                      (value_02);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    value_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar8);
    iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (value_03);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar2 + iVar3;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int FileDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string package = 2;
    if (has_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->package());
    }

  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    // optional .google.protobuf.FileOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (has_source_code_info()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->source_code_info());
    }

  }
  // repeated string dependency = 3;
  total_size += 1 * this->dependency_size();
  for (int i = 0; i < this->dependency_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->dependency(i));
  }

  // repeated int32 public_dependency = 10;
  {
    int data_size = 0;
    for (int i = 0; i < this->public_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->public_dependency(i));
    }
    total_size += 1 * this->public_dependency_size() + data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    int data_size = 0;
    for (int i = 0; i < this->weak_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->weak_dependency(i));
    }
    total_size += 1 * this->weak_dependency_size() + data_size;
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1 * this->message_type_size();
  for (int i = 0; i < this->message_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->message_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1 * this->service_size();
  for (int i = 0; i < this->service_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->service(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}